

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_delete *m)

{
  bool bVar1;
  pointer ppVar2;
  order_book *this_00;
  uint64_t timestamp_00;
  long in_RSI;
  function<void_(const_helix::event_&)> *in_RDI;
  uint64_t timestamp;
  order_book *ob;
  iterator it;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_ffffffffffffff68;
  event *__args;
  order_book *in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x141713);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x141756);
    this_00 = &ppVar2->second;
    order_book::remove(this_00,*(char **)(local_10 + 0xb));
    timestamp_00 = itch50_timestamp(0x141792);
    order_book::set_timestamp(this_00,timestamp_00);
    order_book::symbol_abi_cxx11_(this_00);
    __args = (event *)&stack0xffffffffffffff88;
    make_ob_event(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  (event_mask)((ulong)in_RDI >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()(in_RDI,__args);
    event::~event((event *)0x1417e8);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_delete* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        ob.remove(m->OrderReferenceNumber);
        auto timestamp = itch50_timestamp(m->Timestamp);
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}